

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffm_score.cc
# Opt level: O0

void __thiscall
xLearn::FFMScore::calc_grad_adagrad
          (FFMScore *this,SparseRow *row,Model *model,real_t pg,real_t norm)

{
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined8 uVar11;
  undefined8 uVar12;
  bool bVar13;
  index_t iVar14;
  pointer pNVar15;
  Model *in_RDX;
  long in_RDI;
  float in_XMM0_Da;
  float fVar16;
  double dVar17;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  float in_XMM1_Da;
  __m128 XMMg2;
  __m128 XMMg1;
  __m128 XMMwg2;
  __m128 XMMwg1;
  __m128 XMMw2;
  __m128 XMMw1;
  real_t *wg2;
  real_t *wg1;
  real_t *w2;
  real_t *w1;
  index_t d;
  __m128 XMMpgv;
  __m128 XMMv;
  real_t *w2_base;
  real_t *w1_base;
  real_t v2;
  index_t f2;
  index_t j2;
  const_iterator iter_j;
  real_t v1;
  index_t f1;
  index_t j1;
  const_iterator iter_i;
  __m128 XMMlamb;
  __m128 XMMlr;
  __m128 XMMpg;
  index_t align;
  index_t align1;
  index_t align0;
  real_t g;
  real_t *wbg;
  real_t *wb;
  real_t g_1;
  real_t *wlg;
  real_t *wl;
  index_t feat_id;
  const_iterator iter;
  index_t num_field;
  index_t num_feat;
  real_t *w;
  real_t sqrt_norm;
  undefined4 in_stack_fffffffffffffab8;
  undefined4 in_stack_fffffffffffffabc;
  float fVar23;
  float in_stack_fffffffffffffac0;
  real_t in_stack_fffffffffffffac4;
  uint in_stack_fffffffffffffac8;
  float in_stack_fffffffffffffacc;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  uint local_49c;
  __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
  local_450;
  real_t local_444;
  uint local_440;
  uint local_43c;
  Node *local_438;
  __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
  local_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  int local_3f0;
  int local_3ec;
  uint local_3e8;
  float local_3e4;
  real_t *local_3e0;
  real_t *local_3d8;
  float local_3cc;
  real_t *local_3c8;
  real_t *local_3c0;
  uint local_3b4;
  Node *local_3b0;
  __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
  local_3a8;
  index_t local_3a0;
  index_t local_39c;
  real_t *local_398;
  float local_38c;
  float local_388;
  float local_384;
  Model *local_380;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_34c;
  undefined4 local_348;
  undefined4 uStack_344;
  undefined4 uStack_340;
  undefined4 uStack_33c;
  undefined4 local_32c;
  undefined4 local_328;
  undefined4 uStack_324;
  undefined4 uStack_320;
  undefined4 uStack_31c;
  undefined4 local_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  float local_2ec;
  undefined1 (*local_2e8) [16];
  undefined1 (*local_2e0) [16];
  undefined1 (*local_2d8) [16];
  undefined1 (*local_2d0) [16];
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  undefined8 local_298;
  undefined8 uStack_290;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [16];
  undefined8 local_228;
  undefined8 uStack_220;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined8 local_d8;
  undefined8 uStack_d0;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined1 (*local_90) [16];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined1 (*local_70) [16];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 (*local_50) [16];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined1 (*local_30) [16];
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  local_388 = in_XMM1_Da;
  local_384 = in_XMM0_Da;
  local_380 = in_RDX;
  dVar17 = std::sqrt((double)(ulong)(uint)in_XMM1_Da);
  local_38c = SUB84(dVar17,0);
  local_398 = Model::GetParameter_w(local_380);
  local_39c = Model::GetNumFeature(local_380);
  local_3a0 = Model::GetNumField(local_380);
  local_3a8._M_current =
       (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::begin
                         ((vector<xLearn::Node,_std::allocator<xLearn::Node>_> *)
                          CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
  while( true ) {
    local_3b0 = (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::end
                                  ((vector<xLearn::Node,_std::allocator<xLearn::Node>_> *)
                                   CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
    bVar13 = __gnu_cxx::operator!=
                       ((__normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                         *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                        (__normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                         *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
    if (!bVar13) break;
    pNVar15 = __gnu_cxx::
              __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
              ::operator->(&local_3a8);
    local_3b4 = pNVar15->feat_id;
    if (local_3b4 < local_39c) {
      local_3c0 = local_398 + (local_3b4 << 1);
      local_3c8 = local_398 + (local_3b4 * 2 + 1);
      in_stack_fffffffffffffac8 = *(uint *)(in_RDI + 0xc);
      in_stack_fffffffffffffac4 = *local_3c0;
      in_stack_fffffffffffffac0 = local_384;
      pNVar15 = __gnu_cxx::
                __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                ::operator->(&local_3a8);
      auVar4 = vfmadd213ss_fma(ZEXT416((uint)in_stack_fffffffffffffac4),
                               ZEXT416(in_stack_fffffffffffffac8),
                               ZEXT416((uint)(in_stack_fffffffffffffac0 * pNVar15->feat_val *
                                             local_38c)));
      local_3cc = auVar4._0_4_;
      auVar4 = vfmadd213ss_fma(ZEXT416((uint)local_3cc),ZEXT416((uint)local_3cc),
                               ZEXT416((uint)*local_3c8));
      *local_3c8 = auVar4._0_4_;
      in_stack_fffffffffffffacc = *(float *)(in_RDI + 8) * local_3cc;
      auVar18._0_4_ = InvSqrt(*local_3c8);
      auVar18._4_60_ = extraout_var;
      auVar4 = vfmadd213ss_fma(auVar18._0_16_,ZEXT416((uint)-in_stack_fffffffffffffacc),
                               ZEXT416((uint)*local_3c0));
      *local_3c0 = auVar4._0_4_;
    }
    __gnu_cxx::
    __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
    ::operator++(&local_3a8);
  }
  local_3d8 = Model::GetParameter_b(local_380);
  local_3e0 = local_3d8 + 1;
  local_3e4 = local_384;
  auVar4 = vfmadd213ss_fma(ZEXT416((uint)local_384),ZEXT416((uint)local_384),
                           ZEXT416((uint)*local_3e0));
  *local_3e0 = auVar4._0_4_;
  fVar23 = *(float *)(in_RDI + 8) * local_384;
  local_398 = local_3d8;
  auVar19._0_4_ = InvSqrt(*local_3e0);
  auVar19._4_60_ = extraout_var_00;
  auVar4 = vfnmadd213ss_fma(auVar19._0_16_,ZEXT416((uint)fVar23),ZEXT416((uint)*local_3d8));
  *local_3d8 = auVar4._0_4_;
  iVar14 = Model::get_aligned_k((Model *)0x242b2a);
  local_3e8 = iVar14 * 2;
  iVar14 = Model::GetNumField(local_380);
  local_3ec = iVar14 * local_3e8;
  local_3f0 = 8;
  local_398 = Model::GetParameter_v(local_380);
  local_2ec = local_384;
  local_308 = local_384;
  fStack_304 = local_384;
  fStack_300 = local_384;
  fStack_2fc = local_384;
  local_408 = CONCAT44(local_384,local_384);
  uStack_400 = CONCAT44(local_384,local_384);
  local_328 = *(undefined4 *)(in_RDI + 8);
  local_418 = CONCAT44(local_328,local_328);
  uStack_410 = CONCAT44(local_328,local_328);
  local_348 = *(undefined4 *)(in_RDI + 0xc);
  local_428 = CONCAT44(local_348,local_348);
  uStack_420 = CONCAT44(local_348,local_348);
  uStack_344 = local_348;
  uStack_340 = local_348;
  uStack_33c = local_348;
  local_32c = local_348;
  uStack_324 = local_328;
  uStack_320 = local_328;
  uStack_31c = local_328;
  local_30c = local_328;
  local_430._M_current =
       (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::begin
                         ((vector<xLearn::Node,_std::allocator<xLearn::Node>_> *)
                          CONCAT44(fVar23,in_stack_fffffffffffffab8));
  while( true ) {
    local_438 = (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::end
                                  ((vector<xLearn::Node,_std::allocator<xLearn::Node>_> *)
                                   CONCAT44(fVar23,in_stack_fffffffffffffab8));
    bVar13 = __gnu_cxx::operator!=
                       ((__normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                         *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                        (__normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                         *)CONCAT44(fVar23,in_stack_fffffffffffffab8));
    if (!bVar13) break;
    pNVar15 = __gnu_cxx::
              __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
              ::operator->(&local_430);
    local_43c = pNVar15->feat_id;
    pNVar15 = __gnu_cxx::
              __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
              ::operator->(&local_430);
    local_440 = pNVar15->field_id;
    if ((local_43c < local_39c) && (local_440 < local_3a0)) {
      pNVar15 = __gnu_cxx::
                __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                ::operator->(&local_430);
      local_444 = pNVar15->feat_val;
      local_450 = __gnu_cxx::
                  __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                  ::operator+((__normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                               *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
                              CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0));
      while( true ) {
        std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::end
                  ((vector<xLearn::Node,_std::allocator<xLearn::Node>_> *)
                   CONCAT44(fVar23,in_stack_fffffffffffffab8));
        bVar13 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                             *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                            (__normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                             *)CONCAT44(fVar23,in_stack_fffffffffffffab8));
        if (!bVar13) break;
        pNVar15 = __gnu_cxx::
                  __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                  ::operator->(&local_450);
        uVar1 = pNVar15->feat_id;
        pNVar15 = __gnu_cxx::
                  __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                  ::operator->(&local_450);
        uVar2 = pNVar15->field_id;
        if ((uVar1 < local_39c) && (uVar2 < local_3a0)) {
          pNVar15 = __gnu_cxx::
                    __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                    ::operator->(&local_450);
          local_368 = local_444 * pNVar15->feat_val * local_388;
          local_f8 = CONCAT44(local_368,local_368);
          uStack_f0 = CONCAT44(local_368,local_368);
          local_108 = local_408;
          uVar11 = local_108;
          uStack_100 = uStack_400;
          uVar12 = uStack_100;
          local_108._0_4_ = (float)local_408;
          local_108._4_4_ = (float)((ulong)local_408 >> 0x20);
          uStack_100._0_4_ = (float)uStack_400;
          uStack_100._4_4_ = (float)((ulong)uStack_400 >> 0x20);
          fVar16 = local_368 * (float)local_108;
          fVar20 = local_368 * local_108._4_4_;
          fVar21 = local_368 * (float)uStack_100;
          fVar22 = local_368 * uStack_100._4_4_;
          for (local_49c = 0; fStack_364 = local_368, fStack_360 = local_368, fStack_35c = local_368
              , local_34c = local_368, local_108 = uVar11, uStack_100 = uVar12,
              local_49c < local_3e8; local_49c = local_3f0 + local_49c) {
            local_2d0 = (undefined1 (*) [16])
                        (local_398 +
                        (ulong)(local_43c * local_3ec) +
                        (ulong)(uVar2 * local_3e8) + (ulong)local_49c);
            local_2d8 = (undefined1 (*) [16])
                        (local_398 +
                        (ulong)(uVar1 * local_3ec) +
                        (ulong)(local_440 * local_3e8) + (ulong)local_49c);
            local_2e0 = local_2d0 + 1;
            local_2e8 = local_2d8 + 1;
            local_188 = *(undefined8 *)*local_2d0;
            uStack_180 = *(undefined8 *)(*local_2d0 + 8);
            local_168 = *(undefined8 *)*local_2d8;
            uStack_160 = *(undefined8 *)(*local_2d8 + 8);
            uVar5 = *(undefined8 *)*local_2e0;
            uVar6 = *(undefined8 *)(local_2d0[1] + 8);
            uVar7 = *(undefined8 *)*local_2e8;
            uVar8 = *(undefined8 *)(local_2d8[1] + 8);
            local_118._0_4_ = (float)local_428;
            local_118._4_4_ = (float)((ulong)local_428 >> 0x20);
            uStack_110._0_4_ = (float)uStack_420;
            uStack_110._4_4_ = (float)((ulong)uStack_420 >> 0x20);
            local_128._0_4_ = (float)local_188;
            local_128._4_4_ = (float)((ulong)local_188 >> 0x20);
            uStack_120._0_4_ = (float)uStack_180;
            uStack_120._4_4_ = (float)((ulong)uStack_180 >> 0x20);
            local_258 = (float)local_118 * (float)local_128;
            fStack_254 = local_118._4_4_ * local_128._4_4_;
            fStack_250 = (float)uStack_110 * (float)uStack_120;
            fStack_24c = uStack_110._4_4_ * uStack_120._4_4_;
            local_138 = CONCAT44(fVar20,fVar16);
            uStack_130 = CONCAT44(fVar22,fVar21);
            local_148._0_4_ = (float)local_168;
            local_148._4_4_ = (float)((ulong)local_168 >> 0x20);
            uStack_140._0_4_ = (float)uStack_160;
            uStack_140._4_4_ = (float)((ulong)uStack_160 >> 0x20);
            local_268 = fVar16 * (float)local_148;
            fStack_264 = fVar20 * local_148._4_4_;
            fStack_260 = fVar21 * (float)uStack_140;
            fStack_25c = fVar22 * uStack_140._4_4_;
            local_208 = local_258 + local_268;
            fStack_204 = fStack_254 + fStack_264;
            fStack_200 = fStack_250 + fStack_260;
            fStack_1fc = fStack_24c + fStack_25c;
            local_158 = local_428;
            uStack_150 = uStack_420;
            local_278 = (float)local_118 * (float)local_148;
            fStack_274 = local_118._4_4_ * local_148._4_4_;
            fStack_270 = (float)uStack_110 * (float)uStack_140;
            fStack_26c = uStack_110._4_4_ * uStack_140._4_4_;
            local_178 = CONCAT44(fVar20,fVar16);
            uStack_170 = CONCAT44(fVar22,fVar21);
            local_288 = fVar16 * (float)local_128;
            fStack_284 = fVar20 * local_128._4_4_;
            fStack_280 = fVar21 * (float)uStack_120;
            fStack_27c = fVar22 * uStack_120._4_4_;
            local_248 = local_278 + local_288;
            fStack_244 = fStack_274 + fStack_284;
            fStack_240 = fStack_270 + fStack_280;
            fStack_23c = fStack_26c + fStack_27c;
            local_198 = CONCAT44(fStack_204,local_208);
            uStack_190 = CONCAT44(fStack_1fc,fStack_200);
            local_1a8 = CONCAT44(fStack_204,local_208);
            uStack_1a0 = CONCAT44(fStack_1fc,fStack_200);
            local_2a8 = local_208 * local_208;
            fStack_2a4 = fStack_204 * fStack_204;
            fStack_2a0 = fStack_200 * fStack_200;
            fStack_29c = fStack_1fc * fStack_1fc;
            local_298._0_4_ = (float)uVar5;
            local_298._4_4_ = (float)((ulong)uVar5 >> 0x20);
            uStack_290._0_4_ = (float)uVar6;
            uStack_290._4_4_ = (float)((ulong)uVar6 >> 0x20);
            local_4f8 = CONCAT44(local_298._4_4_ + fStack_2a4,(float)local_298 + local_2a8);
            uStack_4f0 = CONCAT44(uStack_290._4_4_ + fStack_29c,(float)uStack_290 + fStack_2a0);
            local_1b8 = CONCAT44(fStack_244,local_248);
            uStack_1b0 = CONCAT44(fStack_23c,fStack_240);
            local_1c8 = CONCAT44(fStack_244,local_248);
            uStack_1c0 = CONCAT44(fStack_23c,fStack_240);
            local_2c8 = local_248 * local_248;
            fStack_2c4 = fStack_244 * fStack_244;
            fStack_2c0 = fStack_240 * fStack_240;
            fStack_2bc = fStack_23c * fStack_23c;
            local_2b8._0_4_ = (float)uVar7;
            local_2b8._4_4_ = (float)((ulong)uVar7 >> 0x20);
            uStack_2b0._0_4_ = (float)uVar8;
            uStack_2b0._4_4_ = (float)((ulong)uVar8 >> 0x20);
            local_508 = CONCAT44(local_2b8._4_4_ + fStack_2c4,(float)local_2b8 + local_2c8);
            uStack_500 = CONCAT44(uStack_2b0._4_4_ + fStack_2bc,(float)uStack_2b0 + fStack_2c0);
            local_18 = local_4f8;
            uStack_10 = uStack_4f0;
            auVar10._8_8_ = uStack_4f0;
            auVar10._0_8_ = local_4f8;
            _local_1d8 = vrsqrtps_avx(auVar10);
            local_1e8 = CONCAT44(fStack_204,local_208);
            uStack_1e0 = CONCAT44(fStack_1fc,fStack_200);
            local_208 = (float)local_1d8._0_4_ * local_208;
            fStack_204 = (float)local_1d8._4_4_ * fStack_204;
            fStack_200 = fStack_1d0 * fStack_200;
            fStack_1fc = fStack_1cc * fStack_1fc;
            local_1f8._0_4_ = (float)local_418;
            local_1f8._4_4_ = (float)((ulong)local_418 >> 0x20);
            uStack_1f0._0_4_ = (float)uStack_410;
            uStack_1f0._4_4_ = (float)((ulong)uStack_410 >> 0x20);
            local_c8 = (float)local_1f8 * local_208;
            fStack_c4 = local_1f8._4_4_ * fStack_204;
            fStack_c0 = (float)uStack_1f0 * fStack_200;
            fStack_bc = uStack_1f0._4_4_ * fStack_1fc;
            auVar4._4_4_ = fStack_c4;
            auVar4._0_4_ = local_c8;
            auVar4._8_4_ = fStack_c0;
            auVar4._12_4_ = fStack_bc;
            auVar4 = vsubps_avx(*local_2d0,auVar4);
            local_238._8_8_ = uStack_410;
            local_238._0_8_ = local_418;
            local_28 = local_508;
            uStack_20 = uStack_500;
            auVar9._8_8_ = uStack_500;
            auVar9._0_8_ = local_508;
            _local_218 = vrsqrtps_avx(auVar9);
            local_228 = CONCAT44(fStack_244,local_248);
            uStack_220 = CONCAT44(fStack_23c,fStack_240);
            local_248 = (float)local_218._0_4_ * local_248;
            fStack_244 = (float)local_218._4_4_ * fStack_244;
            fStack_240 = fStack_210 * fStack_240;
            fStack_23c = fStack_20c * fStack_23c;
            local_e8 = (float)local_1f8 * local_248;
            fStack_e4 = local_1f8._4_4_ * fStack_244;
            fStack_e0 = (float)uStack_1f0 * fStack_240;
            fStack_dc = uStack_1f0._4_4_ * fStack_23c;
            auVar3._4_4_ = fStack_e4;
            auVar3._0_4_ = local_e8;
            auVar3._8_4_ = fStack_e0;
            auVar3._12_4_ = fStack_dc;
            auVar3 = vsubps_avx(*local_2d8,auVar3);
            local_4d8 = auVar4._0_8_;
            local_48 = local_4d8;
            uStack_4d0 = auVar4._8_8_;
            uStack_40 = uStack_4d0;
            *(undefined8 *)*local_2d0 = local_4d8;
            *(undefined8 *)(*local_2d0 + 8) = uStack_4d0;
            local_4e8 = auVar3._0_8_;
            local_68 = local_4e8;
            uStack_4e0 = auVar3._8_8_;
            uStack_60 = uStack_4e0;
            *(undefined8 *)*local_2d8 = local_4e8;
            *(undefined8 *)(*local_2d8 + 8) = uStack_4e0;
            local_88 = local_4f8;
            uStack_80 = uStack_4f0;
            *(undefined8 *)*local_2e0 = local_4f8;
            *(undefined8 *)(local_2d0[1] + 8) = uStack_4f0;
            local_a8 = local_508;
            uStack_a0 = uStack_500;
            *(undefined8 *)*local_2e8 = local_508;
            *(undefined8 *)(local_2d8[1] + 8) = uStack_500;
            local_2b8 = uVar7;
            uStack_2b0 = uVar8;
            local_298 = uVar5;
            uStack_290 = uVar6;
            local_1f8 = local_418;
            uStack_1f0 = uStack_410;
            local_148 = local_168;
            uStack_140 = uStack_160;
            local_128 = local_188;
            uStack_120 = uStack_180;
            local_118 = local_428;
            uStack_110 = uStack_420;
            local_d8 = local_168;
            uStack_d0 = uStack_160;
            local_b8 = local_188;
            uStack_b0 = uStack_180;
            local_90 = local_2e8;
            local_70 = local_2e0;
            local_50 = local_2d8;
            local_30 = local_2d0;
          }
        }
        __gnu_cxx::
        __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
        ::operator++(&local_450);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
    ::operator++(&local_430);
  }
  return;
}

Assistant:

void FFMScore::calc_grad_adagrad(const SparseRow* row,
                                 Model& model,
                                 real_t pg,
                                 real_t norm) {
  /*********************************************************
   *  linear term and bias term                            *
   *********************************************************/
  real_t sqrt_norm = sqrt(norm);
  real_t *w = model.GetParameter_w();
  index_t num_feat = model.GetNumFeature();
  index_t num_field = model.GetNumField();
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t feat_id = iter->feat_id;
    // To avoid unseen feature
    if (feat_id >= num_feat) continue;
    real_t &wl = w[feat_id*2];
    real_t &wlg = w[feat_id*2+1];
    real_t g = regu_lambda_*wl+pg*iter->feat_val*sqrt_norm;
    wlg += g*g;
    wl -= learning_rate_ * g * InvSqrt(wlg);
  }
  // bias
  w = model.GetParameter_b();
  real_t &wb = w[0];
  real_t &wbg = w[1];
  real_t g = pg;
  wbg += g*g;
  wb -= learning_rate_ * g * InvSqrt(wbg);
  /*********************************************************
   *  latent factor                                        *
   *********************************************************/
  index_t align0 = 2 * model.get_aligned_k();
  index_t align1 = model.GetNumField() * align0;
  index_t align = kAlign * 2;
  w = model.GetParameter_v();
  __m128 XMMpg = _mm_set1_ps(pg);
  __m128 XMMlr = _mm_set1_ps(learning_rate_);
  __m128 XMMlamb = _mm_set1_ps(regu_lambda_);
  for (SparseRow::const_iterator iter_i = row->begin();
       iter_i != row->end(); ++iter_i) {
    index_t j1 = iter_i->feat_id;
    index_t f1 = iter_i->field_id;
    // To avoid unseen feature
    if (j1 >= num_feat || f1 >= num_field) continue;
    real_t v1 = iter_i->feat_val;
    for (SparseRow::const_iterator iter_j = iter_i+1;
         iter_j != row->end(); ++iter_j) {
      index_t j2 = iter_j->feat_id;
      index_t f2 = iter_j->field_id;
      // To avoid unseen feature
      if (j2 >= num_feat || f2 >= num_field) continue;
      real_t v2 = iter_j->feat_val;
      real_t* w1_base = w + j1*align1 + f2*align0;
      real_t* w2_base = w + j2*align1 + f1*align0;
      __m128 XMMv = _mm_set1_ps(v1*v2*norm);
      __m128 XMMpgv = _mm_mul_ps(XMMv, XMMpg);
      for (index_t d = 0; d < align0; d += align) {
        real_t *w1 = w1_base + d;
        real_t *w2 = w2_base + d;
        real_t *wg1 = w1 + kAlign;
        real_t *wg2 = w2 + kAlign;
        __m128 XMMw1 = _mm_load_ps(w1);
        __m128 XMMw2 = _mm_load_ps(w2);
        __m128 XMMwg1 = _mm_load_ps(wg1);
        __m128 XMMwg2 = _mm_load_ps(wg2);
        __m128 XMMg1 = _mm_add_ps(
                       _mm_mul_ps(XMMlamb, XMMw1),
                       _mm_mul_ps(XMMpgv, XMMw2));
        __m128 XMMg2 = _mm_add_ps(
                       _mm_mul_ps(XMMlamb, XMMw2),
                       _mm_mul_ps(XMMpgv, XMMw1));
        XMMwg1 = _mm_add_ps(XMMwg1, _mm_mul_ps(XMMg1, XMMg1));
        XMMwg2 = _mm_add_ps(XMMwg2, _mm_mul_ps(XMMg2, XMMg2));
        XMMw1 = _mm_sub_ps(XMMw1, _mm_mul_ps(XMMlr,
                _mm_mul_ps(_mm_rsqrt_ps(XMMwg1), XMMg1)));
        XMMw2 = _mm_sub_ps(XMMw2, _mm_mul_ps(XMMlr,
                _mm_mul_ps(_mm_rsqrt_ps(XMMwg2), XMMg2)));
        _mm_store_ps(w1, XMMw1);
        _mm_store_ps(w2, XMMw2);
        _mm_store_ps(wg1, XMMwg1);
        _mm_store_ps(wg2, XMMwg2);
      }
    }
  }
}